

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

void __thiscall SQLexer::LexBlockComment(SQLexer *this)

{
  uint uVar1;
  ulong uVar2;
  SQInteger SVar3;
  SQInteger t;
  
  uVar2 = (ulong)this->_currdata;
LAB_001225c9:
  do {
    while ((char)uVar2 == '\0') {
      (*this->_errfunc)(this->_errtarget,"missing \"*/\" in comment");
LAB_00122616:
      uVar2 = (*this->_readf)(this->_up);
      if ((long)uVar2 < 0x100) {
        if (uVar2 != 0) goto LAB_0012263f;
        this->_currdata = '\0';
        this->_reached_eof = 1;
        uVar2 = 0;
      }
      else {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0012263f:
        this->_currdata = (LexChar)uVar2;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    uVar1 = (uint)uVar2 & 0xff;
    if (uVar1 == 10) {
      this->_currentline = this->_currentline + 1;
      goto LAB_00122616;
    }
    if (uVar1 != 0x2a) goto LAB_00122616;
    uVar2 = (*this->_readf)(this->_up);
    if ((long)uVar2 < 0x100) {
      if (uVar2 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar2 = 0;
        goto LAB_001225c9;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)uVar2;
    this->_currentcolumn = this->_currentcolumn + 1;
  } while ((LexChar)uVar2 != '/');
  SVar3 = (*this->_readf)(this->_up);
  if (SVar3 < 0x100) {
    if (SVar3 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
      goto LAB_001226bc;
    }
  }
  else {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  this->_currdata = (LexChar)SVar3;
LAB_001226bc:
  this->_currentcolumn = this->_currentcolumn + 1;
  return;
}

Assistant:

void SQLexer::LexBlockComment()
{
    bool done = false;
    while(!done) {
        switch(CUR_CHAR) {
            case _SC('*'): { NEXT(); if(CUR_CHAR == _SC('/')) { done = true; NEXT(); }}; continue;
            case _SC('\n'): _currentline++; NEXT(); continue;
            case SQUIRREL_EOB: Error(_SC("missing \"*/\" in comment"));
            default: NEXT();
        }
    }
}